

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

AttVal * prvTidyAddAttribute(TidyDocImpl *doc,Node *node,ctmbstr name,ctmbstr value)

{
  AttVal *av_00;
  tmbstr ptVar1;
  Attribute *pAVar2;
  AttVal *av;
  ctmbstr value_local;
  ctmbstr name_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  av_00 = prvTidyNewAttribute(doc);
  av_00->delim = 0x22;
  ptVar1 = prvTidytmbstrdup(doc->allocator,name);
  av_00->attribute = ptVar1;
  if (value == (ctmbstr)0x0) {
    av_00->value = (tmbstr)0x0;
  }
  else {
    ptVar1 = prvTidytmbstrdup(doc->allocator,value);
    av_00->value = ptVar1;
  }
  pAVar2 = attrsLookup(doc,&doc->attribs,name);
  av_00->dict = pAVar2;
  prvTidyInsertAttributeAtEnd(node,av_00);
  return av_00;
}

Assistant:

AttVal* TY_(AddAttribute)( TidyDocImpl* doc,
                           Node *node, ctmbstr name, ctmbstr value )
{
    AttVal *av = TY_(NewAttribute)(doc);
    av->delim = '"';
    av->attribute = TY_(tmbstrdup)(doc->allocator, name);

    if (value)
        av->value = TY_(tmbstrdup)(doc->allocator, value);
    else
        av->value = NULL;

    av->dict = attrsLookup(doc, &doc->attribs, name);

    TY_(InsertAttributeAtEnd)(node, av);
    return av;
}